

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool ON_BinaryArchive::ToggleByteOrder(size_t count,size_t sizeof_element,void *src,void *dst)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  bool bVar10;
  long lVar11;
  size_t sVar12;
  undefined1 auStack_49 [33];
  
  if (count == 0) {
    bVar10 = true;
  }
  else {
    bVar10 = dst != (void *)0x0 && (src != (void *)0x0 && sizeof_element != 0);
  }
  if (bVar10 == true && count != 0) {
    lVar11 = count * sizeof_element;
    puVar1 = (undefined1 *)((long)dst + lVar11);
    if (sizeof_element == 2) {
      if (0 < lVar11) {
        lVar11 = 0;
        do {
          uVar3 = *(undefined1 *)((long)src + lVar11);
          puVar2 = (undefined1 *)((long)dst + lVar11);
          *puVar2 = *(undefined1 *)((long)src + lVar11 + 1);
          puVar2[1] = uVar3;
          lVar11 = lVar11 + 2;
        } while (puVar2 + 2 < puVar1);
      }
    }
    else if (sizeof_element == 4) {
      if (0 < lVar11) {
        lVar11 = 0;
        do {
          uVar3 = *(undefined1 *)((long)src + lVar11);
          uVar4 = *(undefined1 *)((long)src + lVar11 + 1);
          uVar5 = *(undefined1 *)((long)src + lVar11 + 2);
          puVar2 = (undefined1 *)((long)dst + lVar11);
          *puVar2 = *(undefined1 *)((long)src + lVar11 + 3);
          puVar2[1] = uVar5;
          puVar2[2] = uVar4;
          puVar2[3] = uVar3;
          lVar11 = lVar11 + 4;
        } while (puVar2 + 4 < puVar1);
      }
    }
    else if (sizeof_element == 8) {
      if (0 < lVar11) {
        lVar11 = 0;
        do {
          uVar3 = *(undefined1 *)((long)src + lVar11);
          uVar4 = *(undefined1 *)((long)src + lVar11 + 1);
          uVar5 = *(undefined1 *)((long)src + lVar11 + 2);
          uVar6 = *(undefined1 *)((long)src + lVar11 + 3);
          uVar7 = *(undefined1 *)((long)src + lVar11 + 4);
          uVar8 = *(undefined1 *)((long)src + lVar11 + 5);
          uVar9 = *(undefined1 *)((long)src + lVar11 + 6);
          puVar2 = (undefined1 *)((long)dst + lVar11 + 8);
          puVar2[-8] = *(undefined1 *)((long)src + lVar11 + 7);
          puVar2[-7] = uVar9;
          puVar2[-6] = uVar8;
          puVar2[-5] = uVar7;
          puVar2[-4] = uVar6;
          puVar2[-3] = uVar5;
          puVar2[-2] = uVar4;
          puVar2[-1] = uVar3;
          lVar11 = lVar11 + 8;
        } while (puVar2 < puVar1);
      }
    }
    else if (sizeof_element < 0x20) {
      if (0 < lVar11) {
        do {
          sVar12 = 0;
          if (sizeof_element != 0) {
            do {
              auStack_49[sVar12 + 1] = *(undefined1 *)((long)src + sVar12);
              sVar12 = sVar12 + 1;
            } while (sizeof_element != sVar12);
            src = (void *)((long)src + sVar12);
            sVar12 = sizeof_element;
          }
          for (; sVar12 != 0; sVar12 = sVar12 - 1) {
            *(undefined1 *)dst = auStack_49[sVar12];
            dst = (void *)((long)dst + 1);
          }
        } while (dst < puVar1);
      }
    }
    else {
      bVar10 = false;
    }
  }
  return bVar10;
}

Assistant:

bool ON_BinaryArchive::ToggleByteOrder(
  size_t count,          // number of elements
  size_t sizeof_element, // size of element (2,4, or 8)
  const void* src,    // source buffer
  void* dst           // destination buffer (can be same as source buffer)
  )
{
  bool rc = (0 == count || (count > 0 && sizeof_element > 0 && nullptr != src && nullptr != dst));
  if ( rc && count > 0 ) 
  {
    unsigned char c[32];
    const unsigned char* a = (const unsigned char*)src;
    unsigned char* b = (unsigned char*)dst;
    const unsigned char* b1 = b + (count*sizeof_element);

    // loops are unrolled and a switch is used
    // to speed things up a bit.
    switch(sizeof_element) 
    {
    case 2:
      while(b < b1) 
      {
        c[0] = *a++;
        c[1] = *a++;
        *b++ = c[1];
        *b++ = c[0];
      }
      break;

    case 4:
      while(b < b1) 
      {
        c[0] = *a++;
        c[1] = *a++;
        c[2] = *a++;
        c[3] = *a++;
        *b++ = c[3];
        *b++ = c[2];
        *b++ = c[1];
        *b++ = c[0];
      }
      break;

    case 8:
      while(b < b1) 
      {
        c[0] = *a++;
        c[1] = *a++;
        c[2] = *a++;
        c[3] = *a++;
        c[4] = *a++;
        c[5] = *a++;
        c[6] = *a++;
        c[7] = *a++;
        *b++ = c[7];
        *b++ = c[6];
        *b++ = c[5];
        *b++ = c[4];
        *b++ = c[3];
        *b++ = c[2];
        *b++ = c[1];
        *b++ = c[0];
      }
      break;

    default:
      if ( sizeof_element < 32 )
      {
        // As of 2 May 2003, this case is never used
        // by core opennurbs objects.
        //
        // This is here so that future code will work
        // if and when 128 bit "ints"/"doubles" become common
        // enough that they can be stored in 3dm files.
        // It may also happen that third party applications
        // on specialized CPUs need to toggle byte order
        // for 128 bit ints/doubles stored as user data.
        size_t i;
        while(b < b1)
        {
          for (i = 0; i < sizeof_element; i++)
            c[i] = *a++;
          while(i--)
            *b++ = c[i];
        }
      }
      else
      {
        rc = false;
      }
      break;
    }
  }
  return rc;
}